

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O1

Token * __thiscall wabt::WastLexer::GetStringToken(Token *__return_storage_ptr__,WastLexer *this)

{
  char *pcVar1;
  char *pcVar2;
  byte *pbVar3;
  byte *pbVar4;
  Location loc;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  bool bVar10;
  anon_class_8_1_8991fb9c column;
  bool bVar11;
  bool bVar12;
  uint32_t digit;
  uint local_b4;
  size_type local_b0;
  pointer pcStack_a8;
  int local_a0;
  int iStack_9c;
  int iStack_98;
  undefined4 uStack_94;
  size_type local_90;
  pointer pcStack_88;
  int local_80;
  int iStack_7c;
  int iStack_78;
  size_type local_70;
  pointer pcStack_68;
  int local_60;
  int iStack_5c;
  int iStack_58;
  size_type local_50;
  pointer pcStack_48;
  int local_40;
  int iStack_3c;
  int iStack_38;
  
  if (this->cursor_ < this->buffer_end_) {
    this->cursor_ = this->cursor_ + 1;
  }
  pcVar2 = this->token_start_;
  bVar5 = true;
  bVar10 = false;
  do {
    while( true ) {
      pbVar3 = (byte *)this->buffer_end_;
      pbVar4 = (byte *)this->cursor_;
      uVar6 = 0xffffffff;
      if (pbVar4 < pbVar3) {
        this->cursor_ = (char *)(pbVar4 + 1);
        uVar6 = (uint)*pbVar4;
      }
      if (uVar6 != 10) break;
      pcVar1 = this->cursor_ + -1;
      this->token_start_ = pcVar1;
      pcStack_48 = (this->filename_)._M_dataplus._M_p;
      local_50 = (this->filename_)._M_string_length;
      local_40 = this->line_;
      iStack_3c = ((int)pcVar1 - *(int *)&this->line_start_) + 1;
      if (iStack_3c < 2) {
        iStack_3c = 1;
      }
      iStack_38 = ((int)this->cursor_ - *(int *)&this->line_start_) + 1;
      if (iStack_38 < 2) {
        iStack_38 = 1;
      }
      Error(this,0x16a8df);
      this->line_ = this->line_ + 1;
      this->line_start_ = this->cursor_;
      bVar10 = true;
      if (!bVar5) {
        this->token_start_ = pcVar2;
        goto LAB_0012c03f;
      }
    }
    if (uVar6 == 0x5c) {
      pbVar4 = (byte *)this->cursor_;
      uVar6 = 0xffffffff;
      if (pbVar4 < pbVar3) {
        this->cursor_ = (char *)(pbVar4 + 1);
        uVar6 = (uint)*pbVar4;
      }
      uVar8 = uVar6 - 0x22;
      if (uVar8 < 0x3b) {
        if ((0x1f80ffc000U >> ((ulong)uVar8 & 0x3f) & 1) == 0) {
          if ((0x400000000000021U >> ((ulong)uVar8 & 0x3f) & 1) != 0) goto LAB_0012bf30;
          goto LAB_0012bdba;
        }
LAB_0012bdd4:
        pbVar4 = (byte *)this->cursor_;
        if (pbVar4 < pbVar3) {
          lVar9 = (ulong)*pbVar4 + 1;
        }
        else {
          lVar9 = 0;
        }
        if ((""[lVar9] & 4U) != 0) {
          if (pbVar4 < pbVar3) {
            this->cursor_ = (char *)(pbVar4 + 1);
          }
          goto LAB_0012bf30;
        }
        this->token_start_ = (char *)(pbVar4 + -2);
      }
      else {
LAB_0012bdba:
        uVar6 = uVar6 - 0x61;
        if (uVar6 < 0x15) {
          if ((0x3fU >> (uVar6 & 0x1f) & 1) != 0) goto LAB_0012bdd4;
          if ((0xa2000U >> (uVar6 & 0x1f) & 1) != 0) goto LAB_0012bf30;
          if (uVar6 != 0x14) goto LAB_0012bfc1;
          pbVar4 = (byte *)this->cursor_;
          this->token_start_ = (char *)(pbVar4 + -2);
          if ((pbVar4 < pbVar3) && (this->cursor_ = (char *)(pbVar4 + 1), *pbVar4 == 0x7b)) {
            uVar6 = 0;
            do {
              pbVar3 = (byte *)this->buffer_end_;
              pbVar4 = (byte *)this->cursor_;
              if (pbVar4 < pbVar3) {
                lVar9 = (ulong)*pbVar4 + 1;
              }
              else {
                lVar9 = 0;
              }
              if ((""[lVar9] & 4U) == 0) {
                if ((pbVar4 < pbVar3) && (*pbVar4 == 0x7d)) {
                  bVar11 = (uVar6 & 0x1ff800) != 0xd800;
                  bVar12 = (byte *)this->token_start_ != pbVar4 + -3;
                  if ((pbVar3 <= pbVar4) || (bVar12 && bVar11)) {
                    if (bVar12 && bVar11) goto LAB_0012bf30;
                  }
                  else {
                    this->cursor_ = (char *)(pbVar4 + 1);
                  }
                }
                break;
              }
              this->cursor_ = (char *)(pbVar4 + 1);
              ParseHexdigit(*pbVar4,&local_b4);
              uVar6 = uVar6 << 4 | local_b4;
            } while (uVar6 < 0x110000);
          }
        }
        else {
LAB_0012bfc1:
          this->token_start_ = this->cursor_ + -2;
        }
      }
      pcStack_88 = (this->filename_)._M_dataplus._M_p;
      local_90 = (this->filename_)._M_string_length;
      local_80 = this->line_;
      iVar7 = (int)this->token_start_;
      iStack_7c = (iVar7 - *(int *)&this->line_start_) + 1;
      if (iStack_7c < 2) {
        iStack_7c = 1;
      }
      iStack_78 = (*(int *)&this->cursor_ - *(int *)&this->line_start_) + 1;
      if (iStack_78 < 2) {
        iStack_78 = 1;
      }
      Error(this,0x16a906,(char *)(ulong)(uint)(*(int *)&this->cursor_ - iVar7));
LAB_0012bf14:
      bVar10 = true;
    }
    else if (uVar6 == 0x22) {
      pbVar4 = (byte *)this->cursor_;
      if ((pbVar4 < pbVar3) && (*pbVar4 == 0x22)) {
        pcStack_68 = (this->filename_)._M_dataplus._M_p;
        local_70 = (this->filename_)._M_string_length;
        local_60 = this->line_;
        iStack_5c = (*(int *)&this->token_start_ - *(int *)&this->line_start_) + 1;
        if (iStack_5c < 2) {
          iStack_5c = 1;
        }
        iStack_58 = ((int)pbVar4 - *(int *)&this->line_start_) + 1;
        if (iStack_58 < 2) {
          iStack_58 = 1;
        }
        bVar5 = false;
        Error(this,0x16a8f1);
        goto LAB_0012bf14;
      }
      bVar5 = false;
    }
    else if (uVar6 == 0xffffffff) {
      BareToken(__return_storage_ptr__,this,Eof);
      return __return_storage_ptr__;
    }
LAB_0012bf30:
  } while (bVar5);
  this->token_start_ = pcVar2;
  if (bVar10) {
LAB_0012c03f:
    pcStack_a8 = (this->filename_)._M_dataplus._M_p;
    local_b0 = (this->filename_)._M_string_length;
    iStack_9c = ((int)pcVar2 - *(int *)&this->line_start_) + 1;
    if (iStack_9c < 2) {
      iStack_9c = 1;
    }
    local_a0 = this->line_;
    iStack_98 = (*(int *)&this->cursor_ - *(int *)&this->line_start_) + 1;
    if (iStack_98 < 2) {
      iStack_98 = 1;
    }
    loc.filename._M_str._0_4_ = (int)pcStack_a8;
    loc.filename._M_len = local_b0;
    loc.filename._M_str._4_4_ = (int)((ulong)pcStack_a8 >> 0x20);
    loc.field_1.field_0.line = local_a0;
    loc.field_1.field_0.first_column = iStack_9c;
    loc.field_1.field_0.last_column = iStack_98;
    loc.field_1._12_4_ = uStack_94;
    Token::Token(__return_storage_ptr__,loc,First);
  }
  else {
    TextToken(__return_storage_ptr__,this,Text,0);
  }
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetStringToken() {
  const char* saved_token_start = token_start_;
  bool has_error = false;
  bool in_string = true;
  ReadChar();
  while (in_string) {
    switch (ReadChar()) {
      case kEof:
        return BareToken(TokenType::Eof);

      case '\n':
        token_start_ = cursor_ - 1;
        ERROR("newline in string");
        has_error = true;
        Newline();
        continue;

      case '"':
        if (PeekChar() == '"') {
          ERROR("invalid string token");
          has_error = true;
        }
        in_string = false;
        break;

      case '\\': {
        switch (ReadChar()) {
          case 't':
          case 'n':
          case 'r':
          case '"':
          case '\'':
          case '\\':
            // Valid escape.
            break;

          case '0':
          case '1':
          case '2':
          case '3':
          case '4':
          case '5':
          case '6':
          case '7':
          case '8':
          case '9':
          case 'a':
          case 'b':
          case 'c':
          case 'd':
          case 'e':
          case 'f':
          case 'A':
          case 'B':
          case 'C':
          case 'D':
          case 'E':
          case 'F':  // Hex byte escape.
            if (IsHexDigit(PeekChar())) {
              ReadChar();
            } else {
              token_start_ = cursor_ - 2;
              goto error;
            }
            break;

          case 'u': {
            token_start_ = cursor_ - 2;
            if (ReadChar() != '{') {
              goto error;
            }

            // Value must be a valid unicode scalar value.
            uint32_t digit;
            uint32_t scalar_value = 0;

            while (IsHexDigit(PeekChar())) {
              ParseHexdigit(*cursor_++, &digit);

              scalar_value = (scalar_value << 4) | digit;
              // Maximum value of a unicode code point.
              if (scalar_value >= 0x110000) {
                goto error;
              }
            }

            if (PeekChar() != '}') {
              goto error;
            }

            // Scalars between 0xd800 and 0xdfff are not allowed.
            if ((scalar_value >= 0xd800 && scalar_value < 0xe000) ||
                token_start_ == cursor_ - 3) {
              ReadChar();
              goto error;
            }
            break;
          }

          default:
            token_start_ = cursor_ - 2;
            goto error;

          error:
            ERROR("bad escape \"%.*s\"",
                  static_cast<int>(cursor_ - token_start_), token_start_);
            has_error = true;
            break;
        }
        break;
      }
    }
  }
  token_start_ = saved_token_start;
  if (has_error) {
    return Token(GetLocation(), TokenType::Invalid);
  }

  return TextToken(TokenType::Text);
}